

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

void __thiscall
ON_3dmObjectAttributes::SetSectionAttributesSource
          (ON_3dmObjectAttributes *this,SectionAttributesSource source)

{
  SectionAttributesSource SVar1;
  ON_3dmObjectAttributesPrivate *this_00;
  SectionAttributesSource source_local;
  ON_3dmObjectAttributes *this_local;
  
  SVar1 = SectionAttributesSource(this);
  if (SVar1 != source) {
    if (this->m_private == (ON_3dmObjectAttributesPrivate *)0x0) {
      this_00 = (ON_3dmObjectAttributesPrivate *)operator_new(0x158);
      ON_3dmObjectAttributesPrivate::ON_3dmObjectAttributesPrivate(this_00,this);
      this->m_private = this_00;
    }
    this->m_private->m_section_attributes_source = source;
  }
  return;
}

Assistant:

void ON_3dmObjectAttributes::SetSectionAttributesSource(ON::SectionAttributesSource source)
{
  if (SectionAttributesSource() == source)
    return;

  if (nullptr == m_private)
    m_private = new ON_3dmObjectAttributesPrivate(this);
  m_private->m_section_attributes_source = source;
}